

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O2

void * get_column(ecs_iter_t *it,ecs_size_t size,int32_t column,int32_t row)

{
  short sVar1;
  ecs_ref_t *peVar2;
  uint __line;
  _Bool _Var3;
  undefined8 in_RAX;
  void *pvVar4;
  ecs_entity_t *peVar5;
  ecs_entity_t entity;
  int *piVar6;
  void *pvVar7;
  int16_t offset;
  char *pcVar8;
  int iVar9;
  char *__assertion;
  long lVar10;
  ulong uVar11;
  int32_t table_column;
  
  table_column = (int32_t)((ulong)in_RAX >> 0x20);
  if (column == 0) {
    peVar5 = it->entities;
  }
  else {
    _Var3 = get_table_column(it,column,&table_column);
    if (_Var3) {
      if ((long)table_column < 0) {
        peVar2 = it->table->references;
        _ecs_assert(peVar2 != (ecs_ref_t *)0x0,0xc,(char *)0x0,"refs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                    ,0x1b);
        if (peVar2 == (ecs_ref_t *)0x0) {
          __assertion = "refs != ((void*)0)";
          pcVar8 = "const void *get_shared_column(const ecs_iter_t *, ecs_size_t, int32_t)";
          __line = 0x1b;
        }
        else {
          if (size == 0) {
            uVar11 = (ulong)(uint)~table_column;
LAB_00113ff0:
            pvVar7 = ecs_get_ref_w_entity
                               (it->world,peVar2 + uVar11,peVar2[uVar11].entity,
                                peVar2[uVar11].component);
            return pvVar7;
          }
          uVar11 = (ulong)(uint)~table_column;
          entity = ecs_get_typeid(it->world,peVar2[uVar11].component);
          piVar6 = (int *)ecs_get_w_entity(it->world,entity,1);
          _ecs_assert(piVar6 != (int *)0x0,0xc,(char *)0x0,"cdata != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,0x26);
          if (piVar6 == (int *)0x0) {
            __assertion = "cdata != ((void*)0)";
            pcVar8 = "const void *get_shared_column(const ecs_iter_t *, ecs_size_t, int32_t)";
            __line = 0x26;
          }
          else {
            iVar9 = *piVar6;
            pcVar8 = ecs_get_name(it->world,it->system);
            _ecs_assert(iVar9 == size,0x17,pcVar8,"cdata->size == size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                        ,0x28);
            if (*piVar6 == size) goto LAB_00113ff0;
            __assertion = "cdata->size == size";
            pcVar8 = "const void *get_shared_column(const ecs_iter_t *, ecs_size_t, int32_t)";
            __line = 0x28;
          }
        }
      }
      else {
        _ecs_assert(it->table_columns != (void *)0x0,0xc,(char *)0x0,"it->table_columns != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                    ,10);
        pvVar7 = it->table_columns;
        if (pvVar7 == (void *)0x0) {
          __assertion = "it->table_columns != ((void*)0)";
          pcVar8 = "void *get_owned_column_ptr(const ecs_iter_t *, ecs_size_t, int32_t, int32_t)";
          __line = 10;
        }
        else {
          lVar10 = (long)table_column * 0x10;
          _ecs_assert(*(short *)((long)pvVar7 + lVar10 + -8) != 0,0x16,(char *)0x0,
                      "column->size != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,0xe);
          sVar1 = *(short *)((long)pvVar7 + lVar10 + -8);
          if (sVar1 == 0) {
            __assertion = "column->size != 0";
            pcVar8 = "void *get_owned_column_ptr(const ecs_iter_t *, ecs_size_t, int32_t, int32_t)";
            __line = 0xe;
          }
          else {
            _ecs_assert(sVar1 == size || size == 0,0x17,(char *)0x0,"!size || column->size == size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                        ,0xf);
            iVar9 = (int)*(short *)((long)pvVar7 + lVar10 + -8);
            if ((size == 0) || (iVar9 == size)) {
              sVar1 = *(short *)((long)pvVar7 + lVar10 + -6);
              offset = 0x10;
              if (0x10 < sVar1) {
                offset = sVar1;
              }
              pvVar4 = _ecs_vector_first(*(ecs_vector_t **)((long)pvVar7 + lVar10 + -0x10),iVar9,
                                         offset);
              return (void *)(((long)row + (long)it->offset) *
                              (long)*(short *)((long)pvVar7 + lVar10 + -8) + (long)pvVar4);
            }
            __assertion = "!size || column->size == size";
            pcVar8 = "void *get_owned_column_ptr(const ecs_iter_t *, ecs_size_t, int32_t, int32_t)";
            __line = 0xf;
          }
        }
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                    ,__line,pcVar8);
    }
    peVar5 = (ecs_entity_t *)0x0;
  }
  return peVar5;
}

Assistant:

static
void* get_column(
    const ecs_iter_t *it,
    ecs_size_t size,
    int32_t column,
    int32_t row)
{
    int32_t table_column;

    if (!column) {
        return it->entities;
    }

    if (!get_table_column(it, column, &table_column)) {
        return NULL;
    }

    if (table_column < 0) {
        return (void*)get_shared_column(it, size, table_column);
    } else {
        return get_owned_column_ptr(it, size, table_column, row);
    }
}